

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

SectionInfo * __thiscall Catch::SectionInfo::addSubSection(SectionInfo *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  SectionInfo *pSVar3;
  _Rb_tree_header *p_Var4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>
  local_50;
  
  pSVar3 = (SectionInfo *)operator_new(0x40);
  pSVar3->m_status = Unknown;
  p_Var4 = &(pSVar3->m_subSections)._M_t._M_impl.super__Rb_tree_header;
  (pSVar3->m_subSections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar3->m_subSections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pSVar3->m_subSections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  (pSVar3->m_subSections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header
  ;
  (pSVar3->m_subSections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar3->m_parent = this;
  paVar1 = &local_50.first.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_50.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
  local_50.second = pSVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::SectionInfo*>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::SectionInfo*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionInfo*>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::SectionInfo*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::SectionInfo*>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::SectionInfo*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionInfo*>>>
              *)&this->m_subSections,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.first._M_dataplus._M_p,local_50.first.field_2._M_allocated_capacity + 1
                   );
  }
  this->m_status = Branch;
  return pSVar3;
}

Assistant:

SectionInfo* addSubSection( const std::string& name ) {
            SectionInfo* subSection = new SectionInfo( this );
            m_subSections.insert( std::make_pair( name, subSection ) );
            m_status = Branch;
            return subSection;
        }